

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_pic_parameter_set_rbsp(h264_stream_t *h,bs_t *b)

{
  pps_t *__s;
  byte *pbVar1;
  byte bVar2;
  uint32_t r;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  int *useDefaultScalingMatrixFlag;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int (*paiVar11) [16];
  uint uVar12;
  int (*scalingList) [16];
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int (*paiVar17) [16];
  int *piVar18;
  bool bVar19;
  
  __s = h->pps;
  iVar10 = 0;
  memset(__s,0,0x87c);
  pbVar3 = b->p;
  pbVar1 = b->end;
  uVar6 = b->bits_left;
  uVar4 = 0xffffffff;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar19 = true;
    if (pbVar3 < pbVar1) {
      bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar3 = pbVar3 + 1;
      b->p = pbVar3;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar4 = uVar4 + 1;
    iVar10 = iVar10 + -1;
  } while (((bool)(bVar19 & uVar4 < 0x20)) && (pbVar3 < pbVar1));
  iVar7 = 0;
  uVar6 = 0;
  if (iVar10 != -1) {
    iVar5 = -2 - iVar10;
    iVar13 = -3 - iVar10;
    uVar4 = b->bits_left;
    pbVar3 = b->p;
    uVar6 = 0;
    do {
      uVar4 = uVar4 - 1;
      b->bits_left = uVar4;
      uVar15 = 0;
      if (pbVar3 < pbVar1) {
        uVar15 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
      }
      if (uVar4 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar4 = 8;
      }
      uVar6 = uVar6 | uVar15 << ((byte)iVar5 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar13 != -2);
  }
  uVar4 = 0xffffffff;
  __s->pic_parameter_set_id = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar6;
  uVar6 = b->bits_left;
  pbVar3 = b->p;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar19 = true;
    if (pbVar3 < pbVar1) {
      bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar3 = pbVar3 + 1;
      b->p = pbVar3;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar4 = uVar4 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar19 & uVar4 < 0x20)) && (pbVar3 < pbVar1));
  uVar6 = 0;
  uVar4 = 0;
  if (iVar7 != -1) {
    iVar10 = -2 - iVar7;
    iVar5 = -3 - iVar7;
    uVar15 = b->bits_left;
    pbVar3 = b->p;
    uVar4 = 0;
    do {
      uVar15 = uVar15 - 1;
      b->bits_left = uVar15;
      uVar12 = 0;
      if (pbVar3 < pbVar1) {
        uVar12 = (uint)((*pbVar3 >> (uVar15 & 0x1f) & 1) != 0);
      }
      if (uVar15 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar15 = 8;
      }
      uVar4 = uVar4 | uVar12 << ((byte)iVar10 & 0x1f);
      iVar5 = iVar5 + -1;
      iVar10 = iVar10 + -1;
    } while (iVar5 != -2);
  }
  __s->seq_parameter_set_id = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar4;
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar3 = b->p;
  if (pbVar3 < pbVar1) {
    uVar6 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar3 + 1;
    b->bits_left = 8;
  }
  __s->entropy_coding_mode_flag = uVar6;
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar3 = b->p;
  uVar6 = 0;
  if (pbVar3 < pbVar1) {
    uVar6 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar3 + 1;
    b->bits_left = 8;
  }
  __s->pic_order_present_flag = uVar6;
  uVar6 = b->bits_left;
  pbVar3 = b->p;
  uVar4 = 0xffffffff;
  iVar10 = 0;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar19 = true;
    if (pbVar3 < pbVar1) {
      bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar3 = pbVar3 + 1;
      b->p = pbVar3;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar4 = uVar4 + 1;
    iVar10 = iVar10 + -1;
  } while (((bool)(bVar19 & uVar4 < 0x20)) && (pbVar3 < pbVar1));
  if (iVar10 == -1) {
    uVar6 = 0;
  }
  else {
    iVar7 = -2 - iVar10;
    iVar5 = -3 - iVar10;
    uVar4 = b->bits_left;
    pbVar3 = b->p;
    uVar6 = 0;
    do {
      uVar4 = uVar4 - 1;
      b->bits_left = uVar4;
      uVar15 = 0;
      if (pbVar3 < pbVar1) {
        uVar15 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
      }
      if (uVar4 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar4 = 8;
      }
      uVar6 = uVar6 | uVar15 << ((byte)iVar7 & 0x1f);
      iVar5 = iVar5 + -1;
      iVar7 = iVar7 + -1;
    } while (iVar5 != -2);
  }
  uVar4 = 0xffffffff;
  uVar15 = ~(-1 << (~(byte)iVar10 & 0x1f));
  iVar10 = uVar15 + uVar6;
  __s->num_slice_groups_minus1 = iVar10;
  if (iVar10 != 0 && SCARRY4(uVar15,uVar6) == iVar10 < 0) {
    uVar6 = b->bits_left;
    pbVar3 = b->p;
    uVar15 = 0xffffffff;
    iVar10 = 0;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      bVar19 = true;
      if (pbVar3 < pbVar1) {
        bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
      }
      if (uVar6 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar15 = uVar15 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar19 & uVar15 < 0x20)) && (pbVar3 < pbVar1));
    if (iVar10 == -1) {
      uVar6 = 0;
    }
    else {
      iVar7 = -2 - iVar10;
      iVar5 = -3 - iVar10;
      uVar15 = b->bits_left;
      pbVar3 = b->p;
      uVar6 = 0;
      do {
        uVar15 = uVar15 - 1;
        b->bits_left = uVar15;
        uVar12 = 0;
        if (pbVar3 < pbVar1) {
          uVar12 = (uint)((*pbVar3 >> (uVar15 & 0x1f) & 1) != 0);
        }
        if (uVar15 == 0) {
          pbVar3 = pbVar3 + 1;
          b->p = pbVar3;
          b->bits_left = 8;
          uVar15 = 8;
        }
        uVar6 = uVar6 | uVar12 << ((byte)iVar7 & 0x1f);
        iVar5 = iVar5 + -1;
        iVar7 = iVar7 + -1;
      } while (iVar5 != -2);
    }
    iVar10 = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar6;
    __s->slice_group_map_type = iVar10;
    switch(iVar10) {
    case 0:
      if (-1 < __s->num_slice_groups_minus1) {
        pbVar3 = b->p;
        lVar14 = 0;
        do {
          uVar6 = b->bits_left;
          uVar15 = 0xffffffff;
          iVar10 = -2;
          do {
            iVar7 = iVar10;
            uVar12 = uVar15;
            uVar6 = uVar6 - 1;
            b->bits_left = uVar6;
            bVar19 = true;
            if (pbVar3 < pbVar1) {
              bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
            }
            if (uVar6 == 0) {
              pbVar3 = pbVar3 + 1;
              b->p = pbVar3;
              b->bits_left = 8;
              uVar6 = 8;
            }
            uVar15 = uVar12 + 1;
          } while (((bool)(bVar19 & uVar15 < 0x20)) && (iVar10 = iVar7 + 1, pbVar3 < pbVar1));
          if (uVar15 == 0) {
            uVar6 = 0;
          }
          else {
            uVar16 = b->bits_left;
            uVar6 = 0;
            do {
              uVar16 = uVar16 - 1;
              b->bits_left = uVar16;
              uVar8 = 0;
              if (pbVar3 < pbVar1) {
                uVar8 = (uint)((*pbVar3 >> (uVar16 & 0x1f) & 1) != 0);
              }
              if (uVar16 == 0) {
                pbVar3 = pbVar3 + 1;
                b->p = pbVar3;
                b->bits_left = 8;
                uVar16 = 8;
              }
              uVar6 = uVar6 | uVar8 << ((byte)uVar12 & 0x1f);
              uVar12 = uVar12 - 1;
              iVar7 = iVar7 + -1;
            } while (iVar7 != -2);
          }
          __s->run_length_minus1[lVar14] = ~(-1 << ((byte)uVar15 & 0x1f)) + uVar6;
          bVar19 = lVar14 < __s->num_slice_groups_minus1;
          lVar14 = lVar14 + 1;
        } while (bVar19);
      }
      break;
    case 2:
      if (0 < __s->num_slice_groups_minus1) {
        pbVar3 = b->p;
        lVar14 = 0;
        do {
          uVar15 = b->bits_left;
          uVar6 = 0xffffffff;
          iVar10 = -2;
          do {
            iVar7 = iVar10;
            uVar12 = uVar6;
            uVar15 = uVar15 - 1;
            b->bits_left = uVar15;
            bVar19 = true;
            if (pbVar3 < pbVar1) {
              bVar19 = (*pbVar3 >> (uVar15 & 0x1f) & 1) == 0;
            }
            if (uVar15 == 0) {
              pbVar3 = pbVar3 + 1;
              b->p = pbVar3;
              b->bits_left = 8;
              uVar15 = 8;
            }
            uVar6 = uVar12 + 1;
          } while (((bool)(bVar19 & uVar6 < 0x20)) && (iVar10 = iVar7 + 1, pbVar3 < pbVar1));
          if (uVar6 == 0) {
            uVar15 = 0;
          }
          else {
            uVar16 = b->bits_left;
            uVar15 = 0;
            do {
              uVar16 = uVar16 - 1;
              b->bits_left = uVar16;
              uVar8 = 0;
              if (pbVar3 < pbVar1) {
                uVar8 = (uint)((*pbVar3 >> (uVar16 & 0x1f) & 1) != 0);
              }
              if (uVar16 == 0) {
                pbVar3 = pbVar3 + 1;
                b->p = pbVar3;
                b->bits_left = 8;
                uVar16 = 8;
              }
              uVar15 = uVar15 | uVar8 << ((byte)uVar12 & 0x1f);
              uVar12 = uVar12 - 1;
              iVar7 = iVar7 + -1;
            } while (iVar7 != -2);
          }
          __s->top_left[lVar14] = ~(-1 << ((byte)uVar6 & 0x1f)) + uVar15;
          uVar6 = b->bits_left;
          uVar15 = 0xffffffff;
          iVar10 = -2;
          do {
            iVar7 = iVar10;
            uVar12 = uVar15;
            uVar6 = uVar6 - 1;
            b->bits_left = uVar6;
            bVar19 = true;
            if (pbVar3 < pbVar1) {
              bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
            }
            if (uVar6 == 0) {
              pbVar3 = pbVar3 + 1;
              b->p = pbVar3;
              b->bits_left = 8;
              uVar6 = 8;
            }
            uVar15 = uVar12 + 1;
          } while (((bool)(bVar19 & uVar15 < 0x20)) && (iVar10 = iVar7 + 1, pbVar3 < pbVar1));
          if (uVar15 == 0) {
            uVar6 = 0;
          }
          else {
            uVar16 = b->bits_left;
            uVar6 = 0;
            do {
              uVar16 = uVar16 - 1;
              b->bits_left = uVar16;
              uVar8 = 0;
              if (pbVar3 < pbVar1) {
                uVar8 = (uint)((*pbVar3 >> (uVar16 & 0x1f) & 1) != 0);
              }
              if (uVar16 == 0) {
                pbVar3 = pbVar3 + 1;
                b->p = pbVar3;
                b->bits_left = 8;
                uVar16 = 8;
              }
              uVar6 = uVar6 | uVar8 << ((byte)uVar12 & 0x1f);
              uVar12 = uVar12 - 1;
              iVar7 = iVar7 + -1;
            } while (iVar7 != -2);
          }
          __s->bottom_right[lVar14] = ~(-1 << ((byte)uVar15 & 0x1f)) + uVar6;
          lVar14 = lVar14 + 1;
        } while (lVar14 < __s->num_slice_groups_minus1);
      }
      break;
    case 3:
    case 4:
    case 5:
      uVar15 = b->bits_left - 1;
      b->bits_left = uVar15;
      pbVar3 = b->p;
      uVar6 = 0;
      if (pbVar3 < pbVar1) {
        uVar6 = (uint)((*pbVar3 >> (uVar15 & 0x1f) & 1) != 0);
      }
      if (uVar15 == 0) {
        b->p = pbVar3 + 1;
        b->bits_left = 8;
      }
      __s->slice_group_change_direction_flag = uVar6;
      uVar6 = b->bits_left;
      pbVar3 = b->p;
      uVar15 = 0xffffffff;
      iVar10 = 0;
      do {
        uVar6 = uVar6 - 1;
        b->bits_left = uVar6;
        bVar19 = true;
        if (pbVar3 < pbVar1) {
          bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
        }
        if (uVar6 == 0) {
          pbVar3 = pbVar3 + 1;
          b->p = pbVar3;
          b->bits_left = 8;
          uVar6 = 8;
        }
        uVar15 = uVar15 + 1;
        iVar10 = iVar10 + -1;
      } while (((bool)(bVar19 & uVar15 < 0x20)) && (pbVar3 < pbVar1));
      if (iVar10 == -1) {
        uVar6 = 0;
      }
      else {
        iVar7 = -2 - iVar10;
        iVar5 = -3 - iVar10;
        uVar15 = b->bits_left;
        pbVar3 = b->p;
        uVar6 = 0;
        do {
          uVar15 = uVar15 - 1;
          b->bits_left = uVar15;
          uVar12 = 0;
          if (pbVar3 < pbVar1) {
            uVar12 = (uint)((*pbVar3 >> (uVar15 & 0x1f) & 1) != 0);
          }
          if (uVar15 == 0) {
            pbVar3 = pbVar3 + 1;
            b->p = pbVar3;
            b->bits_left = 8;
            uVar15 = 8;
          }
          uVar6 = uVar6 | uVar12 << ((byte)iVar7 & 0x1f);
          iVar5 = iVar5 + -1;
          iVar7 = iVar7 + -1;
        } while (iVar5 != -2);
      }
      __s->slice_group_change_rate_minus1 = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar6;
      break;
    case 6:
      uVar6 = b->bits_left;
      pbVar3 = b->p;
      uVar15 = 0xffffffff;
      iVar10 = 0;
      do {
        uVar6 = uVar6 - 1;
        b->bits_left = uVar6;
        bVar19 = true;
        if (pbVar3 < pbVar1) {
          bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
        }
        if (uVar6 == 0) {
          pbVar3 = pbVar3 + 1;
          b->p = pbVar3;
          b->bits_left = 8;
          uVar6 = 8;
        }
        uVar15 = uVar15 + 1;
        iVar10 = iVar10 + -1;
      } while (((bool)(bVar19 & uVar15 < 0x20)) && (pbVar3 < pbVar1));
      if (iVar10 == -1) {
        uVar6 = 0;
      }
      else {
        iVar7 = -2 - iVar10;
        iVar5 = -3 - iVar10;
        uVar15 = b->bits_left;
        pbVar3 = b->p;
        uVar6 = 0;
        do {
          uVar15 = uVar15 - 1;
          b->bits_left = uVar15;
          uVar12 = 0;
          if (pbVar3 < pbVar1) {
            uVar12 = (uint)((*pbVar3 >> (uVar15 & 0x1f) & 1) != 0);
          }
          if (uVar15 == 0) {
            pbVar3 = pbVar3 + 1;
            b->p = pbVar3;
            b->bits_left = 8;
            uVar15 = 8;
          }
          uVar6 = uVar6 | uVar12 << ((byte)iVar7 & 0x1f);
          iVar5 = iVar5 + -1;
          iVar7 = iVar7 + -1;
        } while (iVar5 != -2);
      }
      iVar10 = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar6;
      __s->pic_size_in_map_units_minus1 = iVar10;
      if (-1 < iVar10) {
        lVar14 = 0;
        do {
          iVar10 = __s->num_slice_groups_minus1;
          if (iVar10 < 0) {
            iVar10 = -1;
          }
          uVar6 = 0xffffffff;
          do {
            uVar15 = uVar6;
            uVar6 = uVar15 + 1;
          } while (iVar10 + 1U >> ((byte)uVar6 & 0x1f) != 0);
          if (iVar10 + 1U != 1 << ((byte)uVar6 - 1 & 0x1f)) {
            uVar15 = uVar6;
          }
          uVar12 = 0;
          if (uVar6 == 0) {
            uVar15 = uVar12;
          }
          if (0 < (int)uVar15) {
            uVar6 = b->bits_left;
            pbVar3 = b->p;
            uVar12 = 0;
            do {
              uVar15 = uVar15 - 1;
              uVar6 = uVar6 - 1;
              b->bits_left = uVar6;
              uVar16 = 0;
              if (pbVar3 < pbVar1) {
                uVar16 = (uint)((*pbVar3 >> (uVar6 & 0x1f) & 1) != 0);
              }
              if (uVar6 == 0) {
                pbVar3 = pbVar3 + 1;
                b->p = pbVar3;
                b->bits_left = 8;
                uVar6 = 8;
              }
              uVar12 = uVar12 | uVar16 << ((byte)uVar15 & 0x1f);
            } while (uVar15 != 0);
          }
          __s->slice_group_id[lVar14] = uVar12;
          bVar19 = lVar14 < __s->pic_size_in_map_units_minus1;
          lVar14 = lVar14 + 1;
        } while (bVar19);
      }
    }
  }
  pbVar3 = b->p;
  pbVar1 = b->end;
  uVar6 = b->bits_left;
  iVar10 = 0;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar19 = true;
    if (pbVar3 < pbVar1) {
      bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar3 = pbVar3 + 1;
      b->p = pbVar3;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar4 = uVar4 + 1;
    iVar10 = iVar10 + -1;
  } while (((bool)(bVar19 & uVar4 < 0x20)) && (pbVar3 < pbVar1));
  iVar7 = 0;
  uVar6 = 0;
  if (iVar10 != -1) {
    iVar5 = -2 - iVar10;
    iVar13 = -3 - iVar10;
    uVar4 = b->bits_left;
    pbVar3 = b->p;
    uVar6 = 0;
    do {
      uVar4 = uVar4 - 1;
      b->bits_left = uVar4;
      uVar15 = 0;
      if (pbVar3 < pbVar1) {
        uVar15 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
      }
      if (uVar4 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar4 = 8;
      }
      uVar6 = uVar6 | uVar15 << ((byte)iVar5 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar13 != -2);
  }
  uVar4 = 0xffffffff;
  __s->num_ref_idx_l0_active_minus1 = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar6;
  uVar6 = b->bits_left;
  pbVar3 = b->p;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar19 = true;
    if (pbVar3 < pbVar1) {
      bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar3 = pbVar3 + 1;
      b->p = pbVar3;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar4 = uVar4 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar19 & uVar4 < 0x20)) && (pbVar3 < pbVar1));
  uVar6 = 0;
  uVar4 = 0;
  if (iVar7 != -1) {
    iVar10 = -2 - iVar7;
    iVar5 = -3 - iVar7;
    uVar15 = b->bits_left;
    pbVar3 = b->p;
    uVar4 = 0;
    do {
      uVar15 = uVar15 - 1;
      b->bits_left = uVar15;
      uVar12 = 0;
      if (pbVar3 < pbVar1) {
        uVar12 = (uint)((*pbVar3 >> (uVar15 & 0x1f) & 1) != 0);
      }
      if (uVar15 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar15 = 8;
      }
      uVar4 = uVar4 | uVar12 << ((byte)iVar10 & 0x1f);
      iVar5 = iVar5 + -1;
      iVar10 = iVar10 + -1;
    } while (iVar5 != -2);
  }
  __s->num_ref_idx_l1_active_minus1 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar4;
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar3 = b->p;
  if (pbVar3 < pbVar1) {
    uVar6 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar3 + 1;
    b->bits_left = 8;
  }
  __s->weighted_pred_flag = uVar6;
  uVar6 = b->bits_left;
  pbVar3 = b->p;
  uVar4 = 0;
  iVar10 = 1;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    uVar15 = 0;
    if (pbVar3 < pbVar1) {
      uVar15 = (uint)((*pbVar3 >> (uVar6 & 0x1f) & 1) != 0);
    }
    if (uVar6 == 0) {
      pbVar3 = pbVar3 + 1;
      b->p = pbVar3;
      b->bits_left = 8;
      uVar6 = 8;
    }
    bVar2 = (byte)iVar10 & 0x1f;
    uVar4 = uVar4 | uVar15 << bVar2;
    bVar19 = iVar10 != 0;
    iVar10 = iVar10 + -1;
  } while (bVar19);
  __s->weighted_bipred_idc = uVar4;
  uVar6 = b->bits_left;
  pbVar3 = b->p;
  uVar4 = 0xffffffff;
  iVar10 = 0 << bVar2;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar19 = true;
    if (pbVar3 < pbVar1) {
      bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar3 = pbVar3 + 1;
      b->p = pbVar3;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar4 = uVar4 + 1;
    iVar10 = iVar10 + -1;
  } while (((bool)(bVar19 & uVar4 < 0x20)) && (pbVar3 < pbVar1));
  iVar7 = 0;
  uVar6 = 0;
  if (iVar10 != -1) {
    iVar5 = -2 - iVar10;
    iVar13 = -3 - iVar10;
    uVar4 = b->bits_left;
    pbVar3 = b->p;
    uVar6 = 0;
    do {
      uVar4 = uVar4 - 1;
      b->bits_left = uVar4;
      uVar15 = 0;
      if (pbVar3 < pbVar1) {
        uVar15 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
      }
      if (uVar4 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar4 = 8;
      }
      uVar6 = uVar6 | uVar15 << ((byte)iVar5 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar13 != -2);
  }
  uVar15 = -1 << (~(byte)iVar10 & 0x1f);
  uVar4 = ~uVar15 + uVar6;
  iVar10 = -((int)uVar4 >> 1);
  if ((uVar4 & 1) != 0) {
    iVar10 = (int)(uVar6 - uVar15) >> 1;
  }
  uVar4 = 0xffffffff;
  __s->pic_init_qp_minus26 = iVar10;
  uVar6 = b->bits_left;
  pbVar3 = b->p;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar19 = true;
    if (pbVar3 < pbVar1) {
      bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar3 = pbVar3 + 1;
      b->p = pbVar3;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar4 = uVar4 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar19 & uVar4 < 0x20)) && (pbVar3 < pbVar1));
  iVar10 = 0;
  uVar6 = 0;
  if (iVar7 != -1) {
    iVar5 = -2 - iVar7;
    iVar13 = -3 - iVar7;
    uVar4 = b->bits_left;
    pbVar3 = b->p;
    uVar6 = 0;
    do {
      uVar4 = uVar4 - 1;
      b->bits_left = uVar4;
      uVar15 = 0;
      if (pbVar3 < pbVar1) {
        uVar15 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
      }
      if (uVar4 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar4 = 8;
      }
      uVar6 = uVar6 | uVar15 << ((byte)iVar5 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar13 != -2);
  }
  uVar15 = -1 << (~(byte)iVar7 & 0x1f);
  uVar4 = ~uVar15 + uVar6;
  iVar7 = -((int)uVar4 >> 1);
  if ((uVar4 & 1) != 0) {
    iVar7 = (int)(uVar6 - uVar15) >> 1;
  }
  uVar4 = 0xffffffff;
  __s->pic_init_qs_minus26 = iVar7;
  uVar6 = b->bits_left;
  pbVar3 = b->p;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    bVar19 = true;
    if (pbVar3 < pbVar1) {
      bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
    }
    if (uVar6 == 0) {
      pbVar3 = pbVar3 + 1;
      b->p = pbVar3;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar4 = uVar4 + 1;
    iVar10 = iVar10 + -1;
  } while (((bool)(bVar19 & uVar4 < 0x20)) && (pbVar3 < pbVar1));
  uVar6 = 0;
  uVar4 = 0;
  if (iVar10 != -1) {
    iVar7 = -2 - iVar10;
    iVar5 = -3 - iVar10;
    uVar15 = b->bits_left;
    pbVar3 = b->p;
    uVar4 = 0;
    do {
      uVar15 = uVar15 - 1;
      b->bits_left = uVar15;
      uVar12 = 0;
      if (pbVar3 < pbVar1) {
        uVar12 = (uint)((*pbVar3 >> (uVar15 & 0x1f) & 1) != 0);
      }
      if (uVar15 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar15 = 8;
      }
      uVar4 = uVar4 | uVar12 << ((byte)iVar7 & 0x1f);
      iVar5 = iVar5 + -1;
      iVar7 = iVar7 + -1;
    } while (iVar5 != -2);
  }
  uVar12 = -1 << (~(byte)iVar10 & 0x1f);
  uVar15 = ~uVar12 + uVar4;
  iVar10 = -((int)uVar15 >> 1);
  if ((uVar15 & 1) != 0) {
    iVar10 = (int)(uVar4 - uVar12) >> 1;
  }
  __s->chroma_qp_index_offset = iVar10;
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar3 = b->p;
  if (pbVar3 < pbVar1) {
    uVar6 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar3 + 1;
    b->bits_left = 8;
  }
  __s->deblocking_filter_control_present_flag = uVar6;
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar3 = b->p;
  uVar6 = 0;
  if (pbVar3 < pbVar1) {
    uVar6 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar3 + 1;
    b->bits_left = 8;
  }
  __s->constrained_intra_pred_flag = uVar6;
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar3 = b->p;
  uVar6 = 0;
  if (pbVar3 < pbVar1) {
    uVar6 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar3 + 1;
    b->bits_left = 8;
  }
  __s->redundant_pic_cnt_present_flag = uVar6;
  iVar10 = more_rbsp_data(b);
  if (iVar10 != 0) {
    uVar4 = b->bits_left - 1;
    b->bits_left = uVar4;
    pbVar3 = b->p;
    uVar6 = 0;
    if (pbVar3 < pbVar1) {
      uVar6 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      b->p = pbVar3 + 1;
      b->bits_left = 8;
    }
    __s->transform_8x8_mode_flag = uVar6;
    uVar4 = b->bits_left - 1;
    b->bits_left = uVar4;
    pbVar3 = b->p;
    uVar6 = 0;
    if (pbVar3 < pbVar1) {
      uVar6 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      b->p = pbVar3 + 1;
      b->bits_left = 8;
    }
    __s->pic_scaling_matrix_present_flag = uVar6;
    if ((uVar6 != 0) && (-3 < __s->transform_8x8_mode_flag)) {
      paiVar17 = __s->ScalingList4x4;
      piVar18 = __s->ScalingList8x8[1] + 0x3a;
      paiVar11 = (int (*) [16])(__s->bottom_right + 6);
      uVar9 = 0xffffffffffffffff;
      do {
        uVar4 = b->bits_left - 1;
        b->bits_left = uVar4;
        pbVar3 = b->p;
        uVar6 = 0;
        if (pbVar3 < b->end) {
          uVar6 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          b->p = pbVar3 + 1;
          b->bits_left = 8;
        }
        uVar9 = uVar9 + 1;
        piVar18[-0xe8] = uVar6;
        if (uVar6 != 0) {
          if (uVar9 < 6) {
            iVar10 = 0x10;
            useDefaultScalingMatrixFlag = piVar18 + -0x80;
            scalingList = paiVar17;
          }
          else {
            iVar10 = 0x40;
            useDefaultScalingMatrixFlag = piVar18;
            scalingList = paiVar11;
          }
          read_scaling_list(b,*scalingList,iVar10,useDefaultScalingMatrixFlag);
        }
        piVar18 = piVar18 + 1;
        paiVar17 = paiVar17 + 1;
        paiVar11 = paiVar11 + 4;
      } while ((long)uVar9 < (long)__s->transform_8x8_mode_flag * 2 + 5);
    }
    pbVar3 = b->p;
    pbVar1 = b->end;
    uVar6 = b->bits_left;
    uVar4 = 0xffffffff;
    iVar10 = 0;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      bVar19 = true;
      if (pbVar3 < pbVar1) {
        bVar19 = (*pbVar3 >> (uVar6 & 0x1f) & 1) == 0;
      }
      if (uVar6 == 0) {
        pbVar3 = pbVar3 + 1;
        b->p = pbVar3;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar4 = uVar4 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar19 & uVar4 < 0x20)) && (pbVar3 < pbVar1));
    if (iVar10 == -1) {
      uVar6 = 0;
    }
    else {
      iVar7 = -2 - iVar10;
      iVar5 = -3 - iVar10;
      uVar4 = b->bits_left;
      pbVar3 = b->p;
      uVar6 = 0;
      do {
        uVar4 = uVar4 - 1;
        b->bits_left = uVar4;
        uVar15 = 0;
        if (pbVar3 < pbVar1) {
          uVar15 = (uint)((*pbVar3 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar3 = pbVar3 + 1;
          b->p = pbVar3;
          b->bits_left = 8;
          uVar4 = 8;
        }
        uVar6 = uVar6 | uVar15 << ((byte)iVar7 & 0x1f);
        iVar5 = iVar5 + -1;
        iVar7 = iVar7 + -1;
      } while (iVar5 != -2);
    }
    uVar15 = -1 << (~(byte)iVar10 & 0x1f);
    uVar4 = ~uVar15 + uVar6;
    iVar10 = -((int)uVar4 >> 1);
    if ((uVar4 & 1) != 0) {
      iVar10 = (int)(uVar6 - uVar15) >> 1;
    }
    __s->second_chroma_qp_index_offset = iVar10;
  }
  memcpy(h->pps_table[__s->pic_parameter_set_id],h->pps,0x87c);
  return;
}

Assistant:

void read_pic_parameter_set_rbsp(h264_stream_t* h, bs_t* b)
{
    pps_t* pps = h->pps;
    if( 1 )
    {
        memset(pps, 0, sizeof(pps_t));
    }

    pps->pic_parameter_set_id = bs_read_ue(b);
    pps->seq_parameter_set_id = bs_read_ue(b);
    pps->entropy_coding_mode_flag = bs_read_u1(b);
    pps->pic_order_present_flag = bs_read_u1(b);
    pps->num_slice_groups_minus1 = bs_read_ue(b);

    if( pps->num_slice_groups_minus1 > 0 )
    {
        pps->slice_group_map_type = bs_read_ue(b);
        if( pps->slice_group_map_type == 0 )
        {
            for( int i_group = 0; i_group <= pps->num_slice_groups_minus1; i_group++ )
            {
                pps->run_length_minus1[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 2 )
        {
            for( int i_group = 0; i_group < pps->num_slice_groups_minus1; i_group++ )
            {
                pps->top_left[ i_group ] = bs_read_ue(b);
                pps->bottom_right[ i_group ] = bs_read_ue(b);
            }
        }
        else if( pps->slice_group_map_type == 3 ||
                 pps->slice_group_map_type == 4 ||
                 pps->slice_group_map_type == 5 )
        {
            pps->slice_group_change_direction_flag = bs_read_u1(b);
            pps->slice_group_change_rate_minus1 = bs_read_ue(b);
        }
        else if( pps->slice_group_map_type == 6 )
        {
            pps->pic_size_in_map_units_minus1 = bs_read_ue(b);
            for( int i = 0; i <= pps->pic_size_in_map_units_minus1; i++ )
            {
                int v = intlog2( pps->num_slice_groups_minus1 + 1 );
                pps->slice_group_id[ i ] = bs_read_u(b, v);
            }
        }
    }
    pps->num_ref_idx_l0_active_minus1 = bs_read_ue(b);
    pps->num_ref_idx_l1_active_minus1 = bs_read_ue(b);
    pps->weighted_pred_flag = bs_read_u1(b);
    pps->weighted_bipred_idc = bs_read_u(b, 2);
    pps->pic_init_qp_minus26 = bs_read_se(b);
    pps->pic_init_qs_minus26 = bs_read_se(b);
    pps->chroma_qp_index_offset = bs_read_se(b);
    pps->deblocking_filter_control_present_flag = bs_read_u1(b);
    pps->constrained_intra_pred_flag = bs_read_u1(b);
    pps->redundant_pic_cnt_present_flag = bs_read_u1(b);

    int have_more_data = 0;
    if( 1 ) { have_more_data = more_rbsp_data(b); }
    if( 0 )
    {
        have_more_data = pps->transform_8x8_mode_flag | pps->pic_scaling_matrix_present_flag | pps->second_chroma_qp_index_offset != 0;
    }

    if( have_more_data )
    {
        pps->transform_8x8_mode_flag = bs_read_u1(b);
        pps->pic_scaling_matrix_present_flag = bs_read_u1(b);
        if( pps->pic_scaling_matrix_present_flag )
        {
            for( int i = 0; i < 6 + 2* pps->transform_8x8_mode_flag; i++ )
            {
                pps->pic_scaling_list_present_flag[ i ] = bs_read_u1(b);
                if( pps->pic_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_scaling_list( b, pps->ScalingList4x4[ i ], 16,
                                                 &( pps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        read_scaling_list( b, pps->ScalingList8x8[ i - 6 ], 64,
                                                 &( pps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
        pps->second_chroma_qp_index_offset = bs_read_se(b);
    }

    if( 1 )
    {
        memcpy(h->pps_table[pps->pic_parameter_set_id], h->pps, sizeof(pps_t));
    }
}